

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

mh_assoc_t * mh_assoc_new(void)

{
  mh_assoc_t *h_00;
  mh_assoc_t *pmVar1;
  assoc_val **ppaVar2;
  mh_int_t *pmVar3;
  mh_assoc_t *h;
  
  h_00 = (mh_assoc_t *)tnt_mem_calloc(1,0x38);
  if (h_00 != (mh_assoc_t *)0x0) {
    memset(h_00,0,0x38);
    pmVar1 = (mh_assoc_t *)tnt_mem_calloc(1,0x38);
    h_00->shadow = pmVar1;
    if (h_00->shadow != (mh_assoc_t *)0x0) {
      h_00->prime = 0;
      h_00->n_buckets = __ac_prime_list[h_00->prime];
      ppaVar2 = (assoc_val **)tnt_mem_calloc((ulong)h_00->n_buckets,8);
      h_00->p = ppaVar2;
      if (h_00->p != (assoc_val **)0x0) {
        pmVar3 = (mh_int_t *)tnt_mem_calloc((ulong)((h_00->n_buckets >> 4) + 1),4);
        h_00->b = pmVar3;
        if (h_00->b != (mh_int_t *)0x0) {
          h_00->upper_bound = (mh_int_t)(long)((double)h_00->n_buckets * 0.7);
          return h_00;
        }
      }
    }
    mh_assoc_delete(h_00);
  }
  return (mh_assoc_t *)0x0;
}

Assistant:

struct _mh(t) *
_mh(new)()
{
	struct _mh(t) *h = (struct _mh(t) *) MH_CALLOC(1, sizeof(*h));
	if (!h) return NULL;
	memset(h, 0, sizeof(struct _mh(t)));
	h->shadow = (struct _mh(t) *) MH_CALLOC(1, sizeof(*h));
	if (!h->shadow) goto error;
	h->prime = 0;
	h->n_buckets = __ac_prime_list[h->prime];
	h->p = (mh_node_t *) MH_CALLOC(h->n_buckets, sizeof(mh_node_t));
	if (!h->p) goto error;
	h->b = (mh_int_t *) MH_CALLOC(h->n_buckets / 16 + 1, sizeof(mh_int_t));
	if (!h->b) goto error;
	h->upper_bound = h->n_buckets * MH_DENSITY;
	return h;
error:
	_mh(delete)(h);
	return NULL;
}